

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::~TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer ppMVar2;
  pointer ppJVar3;
  pointer ppMVar4;
  pointer ppJVar5;
  
  pvVar1 = *vtt;
  *(void **)&this->super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 + *(long *)((long)pvVar1 + -0x40)) =
       vtt[3];
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 +
            *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x48)) = vtt[4];
  ppMVar2 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar4 = (this->_m_individualMADPDs).
                 super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar4 != ppMVar2;
      ppMVar4 = ppMVar4 + 1) {
    if (*ppMVar4 != (MultiAgentDecisionProcessDiscrete *)0x0) {
      (**(code **)(*(long *)&(*ppMVar4)->super_MultiAgentDecisionProcess + 8))();
    }
  }
  ppMVar4 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_individualMADPDs).
      super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar4) {
    (this->_m_individualMADPDs).
    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppMVar4;
  }
  ppJVar3 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar5 = (this->_m_jointActionVec).
                 super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppJVar5 != ppJVar3; ppJVar5 = ppJVar5 + 1
      ) {
    if (*ppJVar5 != (JointActionDiscrete *)0x0) {
      (*((*ppJVar5)->super_JointAction)._vptr_JointAction[1])();
    }
  }
  ppJVar5 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionVec).
      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar5) {
    (this->_m_jointActionVec).
    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppJVar5;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_jointToIndObsCache);
  std::_Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
  ~_Vector_base(&(this->_m_jointObs).
                 super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
               );
  std::
  vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ::~vector(&this->_m_indivObs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrIndivObs).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrIndivActions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base
            (&(this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_indivStateIndices);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrIndivStates).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_stateStepSize).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_observationStepSize).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_actionStepSize).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_jointToIndActionCache);
  std::_Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::~_Vector_base
            (&(this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>);
  std::
  _Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::~_Vector_base(&(this->_m_individualMADPDs).
                   super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                 );
  MultiAgentDecisionProcess::~MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,vtt + 1);
  return;
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
~TransitionObservationIndependentMADPDiscrete()
{
    // this destructor leaks memory

    vector<MultiAgentDecisionProcessDiscrete*>::iterator it = 
        _m_individualMADPDs.begin();
    vector<MultiAgentDecisionProcessDiscrete*>::iterator last = 
        _m_individualMADPDs.end();
    while(it != last)
    {
        delete *it;//pointer to MultiAgentDecisionProcessDiscrete
        it++;
    }
    _m_individualMADPDs.clear();
    
    vector<JointActionDiscrete*>::iterator it2 = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = 
        _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //pointer to MultiAgentDecisionProcessDiscrete
        it2++;
    }
    _m_jointActionVec.clear();
}